

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall
OpenMesh::PolyConnectivity::delete_edge
          (PolyConnectivity *this,EdgeHandle _eh,bool _delete_isolated_vertices)

{
  FaceHandle _fh;
  FaceHandle _fh_00;
  BaseHandle BVar1;
  Halfedge *pHVar2;
  reference pvVar3;
  HalfedgeHandle _heh;
  
  pHVar2 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,(HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2))
  ;
  _fh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  _heh.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2 + 1);
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh);
  _fh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  if (_fh.super_BaseHandle.idx_ == -1) {
    if (_fh_00.super_BaseHandle.idx_ == -1) {
      BVar1.idx_ = (this->super_ArrayKernel).edge_status_.
                   super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
      if ((BaseHandle)BVar1.idx_ != (BaseHandle)0xffffffff) {
        pvVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                           ((BaseKernel *)this,
                            (EPropHandleT<OpenMesh::Attributes::StatusInfo>)BVar1.idx_,
                            (EdgeHandle)_eh.super_BaseHandle.idx_);
        *(byte *)&pvVar3->status_ = (byte)pvVar3->status_ | 1;
      }
      BVar1.idx_ = (this->super_ArrayKernel).halfedge_status_.
                   super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
      if ((BaseHandle)BVar1.idx_ == (BaseHandle)0xffffffff) {
        return;
      }
      pvVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                         ((BaseKernel *)this,
                          (HPropHandleT<OpenMesh::Attributes::StatusInfo>)BVar1.idx_,
                          (HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2));
      *(byte *)&pvVar3->status_ = (byte)pvVar3->status_ | 1;
      pvVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                         ((BaseKernel *)this,
                          (HPropHandleT<OpenMesh::Attributes::StatusInfo>)
                          (this->super_ArrayKernel).halfedge_status_.
                          super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                          idx_,(HalfedgeHandle)_heh.super_BaseHandle.idx_);
      *(byte *)&pvVar3->status_ = (byte)pvVar3->status_ | 1;
      return;
    }
  }
  else {
    delete_face(this,_fh,_delete_isolated_vertices);
    if (_fh_00.super_BaseHandle.idx_ == -1) {
      return;
    }
  }
  delete_face(this,_fh_00,_delete_isolated_vertices);
  return;
}

Assistant:

void PolyConnectivity::delete_edge(EdgeHandle _eh, bool _delete_isolated_vertices)
{
  FaceHandle fh0(face_handle(halfedge_handle(_eh, 0)));
  FaceHandle fh1(face_handle(halfedge_handle(_eh, 1)));

  if (fh0.is_valid())  delete_face(fh0, _delete_isolated_vertices);
  if (fh1.is_valid())  delete_face(fh1, _delete_isolated_vertices);

  // If there is no face, we delete the edge
  // here
  if ( ! fh0.is_valid() && !fh1.is_valid()) {
    // mark edge deleted if the mesh has a edge status
    if ( has_edge_status() )
      status(_eh).set_deleted(true);

    // mark corresponding halfedges as deleted
    // As the deleted edge is boundary,
    // all corresponding halfedges will also be deleted.
    if ( has_halfedge_status() ) {
      status(halfedge_handle(_eh, 0)).set_deleted(true);
      status(halfedge_handle(_eh, 1)).set_deleted(true);
    }
  }
}